

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::Port> __thiscall kratos::Generator::get_port(Generator *this,string *port_name)

{
  bool bVar1;
  mapped_type *pmVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<kratos::Port> sVar4;
  undefined1 local_40 [8];
  mapped_type var_p;
  _Self local_28;
  key_type *local_20;
  string *port_name_local;
  Generator *this_local;
  
  local_20 = in_RDX;
  port_name_local = port_name;
  this_local = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&port_name[9].field_2,in_RDX);
  var_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&port_name[9].field_2);
  bVar1 = std::operator==(&local_28,
                          (_Self *)&var_p.
                                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
  if (bVar1) {
    std::shared_ptr<kratos::Port>::shared_ptr((shared_ptr<kratos::Port> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *)(port_name + 8),local_20);
    std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)local_40,pmVar2);
    std::static_pointer_cast<kratos::Port,kratos::Var>((shared_ptr<kratos::Var> *)this);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_40);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Port>)
         sVar4.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Port> Generator::get_port(const std::string &port_name) const {
    if (ports_.find(port_name) == ports_.end()) return nullptr;
    auto var_p = vars_.at(port_name);
    return std::static_pointer_cast<Port>(var_p);
}